

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::DisposeObjects
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->isPendingDispose == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x1cd,"(this->isPendingDispose)","this->isPendingDispose");
    if (!bVar2) goto LAB_0073c17a;
    *puVar3 = 0;
  }
  if ((this->pendingDisposeCount == 0) && (this->disposedObjectList == (FreeObject *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x1ce,"(HasAnyDisposeObjects())","HasAnyDisposeObjects()");
    if (!bVar2) goto LAB_0073c17a;
    *puVar3 = 0;
  }
  ForEachPendingDisposeObject<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::DisposeObjects()::_lambda(unsigned_int)_1_>
            (this,(anon_class_8_1_8991fb9c)this);
  if ((this->pendingDisposeCount != 0) &&
     (((this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.heapBucket)->heapInfo->recycler->
      hasDisposableObject == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x1f8,
                       "(this->pendingDisposeCount == 0 || this->heapBucket->heapInfo->recycler->hasDisposableObject)"
                       ,
                       "this->pendingDisposeCount == 0 || this->heapBucket->heapInfo->recycler->hasDisposableObject"
                      );
    if (!bVar2) {
LAB_0073c17a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
SmallFinalizableHeapBlockT<TBlockAttributes>::DisposeObjects()
{
    Assert(this->isPendingDispose);
    Assert(HasAnyDisposeObjects());

    // PARTIALGC-CONSIDER: page with finalizable/disposable object will always be modified
    // because calling dispose probably will modify object itself, and it may call other
    // script that might touch the page as well.  We can't distinguish between these two kind
    // of write to the page.
    //
    // Possible mitigation include:
    //      - allocating finalizable/disposable object on separate pages
    //      - some of the object only need finalize, but not dispose.  mark them separately
    //
    // For now, we always touch the page by zeroing out disposed object which should be moved as well.

    ForEachPendingDisposeObject([&] (uint index) {
        void * objectAddress = this->address + (this->objectSize * index);

        // Dispose the object.
        // Note that Dispose can cause reentrancy, which can cause allocation, which can cause collection.
        // The object we're disposing is still considered PendingDispose until the Dispose call completes.
        // So in case we call CheckFreeBitVector or similar, we should still see correct state re this object.

        ((FinalizableObject *)objectAddress)->Dispose(false);

        Assert(finalizeCount != 0);
        finalizeCount--;
        Assert(pendingDisposeCount != 0);
        pendingDisposeCount--;

        // Properly enqueue the processed object
        // This will also clear the ObjectInfo bits so it's not marked as PendingDispose anymore
        this->EnqueueProcessedObject(&disposedObjectList, &disposedObjectListTail, objectAddress, index);

        RECYCLER_STATS_INC(this->heapBucket->heapInfo->recycler, finalizeSweepCount);
#ifdef RECYCLER_FINALIZE_CHECK
        this->heapBucket->heapInfo->liveFinalizableObjectCount--;
        this->heapBucket->heapInfo->pendingDisposableObjectCount--;
#endif
    });

    // Dispose could have re-entered and caused new pending dispose objects on this block.
    // If so, recycler->hasDisposableObject will have been set again, and we will do another
    // round of Dispose to actually dispose these objects.
    Assert(this->pendingDisposeCount == 0 || this->heapBucket->heapInfo->recycler->hasDisposableObject);
}